

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::LoadStoreMachine::RunStage(LoadStoreMachine *this,int stage)

{
  bool bVar1;
  Vector<float,_4> local_4fc;
  Vector<float,_4> local_4ec;
  Vector<float,_4> local_4dc;
  Vector<float,_4> local_4cc;
  Vector<float,_4> local_4bc;
  Vector<float,_4> local_4ac;
  Vector<float,_4> local_49c;
  Vector<float,_4> local_48c;
  Vector<float,_4> local_47c;
  Vector<float,_4> local_46c;
  Vector<float,_4> local_45c;
  Vector<float,_4> local_44c;
  Vector<float,_4> local_43c;
  Vector<float,_4> local_42c;
  Vector<float,_4> local_41c;
  Vector<float,_4> local_40c;
  Vector<float,_4> local_3fc;
  Vector<float,_4> local_3ec;
  Vector<float,_4> local_3dc;
  Vector<float,_4> local_3cc;
  Vector<float,_4> local_3bc;
  Vector<float,_4> local_3ac;
  Vector<float,_4> local_39c;
  Vector<float,_4> local_38c;
  Vector<float,_4> local_37c;
  Vector<float,_4> local_36c;
  Vector<unsigned_int,_4> local_35c;
  Vector<unsigned_int,_4> local_34c;
  Vector<unsigned_int,_4> local_33c;
  Vector<unsigned_int,_4> local_32c;
  Vector<unsigned_int,_4> local_31c;
  Vector<unsigned_int,_4> local_30c;
  Vector<unsigned_int,_4> local_2fc;
  Vector<unsigned_int,_4> local_2ec;
  Vector<unsigned_int,_4> local_2dc;
  Vector<unsigned_int,_4> local_2cc;
  Vector<unsigned_int,_4> local_2bc;
  Vector<unsigned_int,_4> local_2ac;
  Vector<unsigned_int,_4> local_29c;
  Vector<unsigned_int,_4> local_28c;
  Vector<unsigned_int,_4> local_27c;
  Vector<unsigned_int,_4> local_26c;
  Vector<unsigned_int,_4> local_25c;
  Vector<unsigned_int,_4> local_24c;
  Vector<unsigned_int,_4> local_23c;
  Vector<unsigned_int,_4> local_22c;
  Vector<int,_4> local_21c;
  Vector<int,_4> local_20c;
  Vector<int,_4> local_1fc;
  Vector<int,_4> local_1ec;
  Vector<int,_4> local_1dc;
  Vector<int,_4> local_1cc;
  Vector<int,_4> local_1bc;
  Vector<int,_4> local_1ac;
  Vector<int,_4> local_19c;
  Vector<int,_4> local_18c;
  Vector<int,_4> local_17c;
  Vector<int,_4> local_16c;
  Vector<float,_4> local_15c;
  Vector<float,_4> local_14c;
  Vector<int,_4> local_13c;
  Vector<int,_4> local_12c;
  Vector<int,_4> local_11c;
  Vector<int,_4> local_10c;
  Vector<int,_4> local_fc;
  Vector<int,_4> local_ec;
  Vector<float,_4> local_dc;
  Vector<float,_4> local_cc;
  Vector<float,_4> local_bc;
  Vector<float,_4> local_ac;
  Vector<float,_4> local_9c;
  Vector<float,_4> local_8c;
  Vector<float,_4> local_7c;
  Vector<float,_4> local_6c;
  Vector<float,_4> local_5c;
  Vector<float,_4> local_4c;
  Vector<float,_4> local_3c;
  Vector<float,_4> local_2c;
  int local_1c;
  LoadStoreMachine *pLStack_18;
  int stage_local;
  LoadStoreMachine *this_local;
  
  local_1c = stage;
  pLStack_18 = this;
  bVar1 = ShaderImageLoadStoreBase::SupportedInStage(&this->super_ShaderImageLoadStoreBase,stage,8);
  if (bVar1) {
    glu::CallLogWrapper::glEnable
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c89);
    this->m_stage = local_1c;
    tcu::Vector<float,_4>::Vector(&local_2c,1.0,2.0,3.0,4.0);
    tcu::Vector<float,_4>::Vector(&local_3c,1.0,2.0,3.0,4.0);
    bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                      ((LoadStoreMachine *)this,0x8814,&local_2c,&local_3c);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<float,_4>::Vector(&local_4c,1.0,2.0,3.0,4.0);
      tcu::Vector<float,_4>::Vector(&local_5c,1.0,2.0,0.0,1.0);
      bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                        ((LoadStoreMachine *)this,0x8230,&local_4c,&local_5c);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<float,_4>::Vector(&local_6c,1.0,2.0,3.0,4.0);
        tcu::Vector<float,_4>::Vector(&local_7c,1.0,0.0,0.0,1.0);
        bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                          ((LoadStoreMachine *)this,0x822e,&local_6c,&local_7c);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          tcu::Vector<float,_4>::Vector(&local_8c,1.0,2.0,3.0,4.0);
          tcu::Vector<float,_4>::Vector(&local_9c,1.0,2.0,3.0,4.0);
          bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                            ((LoadStoreMachine *)this,0x881a,&local_8c,&local_9c);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            tcu::Vector<float,_4>::Vector(&local_ac,1.0,2.0,3.0,4.0);
            tcu::Vector<float,_4>::Vector(&local_bc,1.0,2.0,0.0,1.0);
            bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                              ((LoadStoreMachine *)this,0x822f,&local_ac,&local_bc);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              tcu::Vector<float,_4>::Vector(&local_cc,1.0,2.0,3.0,4.0);
              tcu::Vector<float,_4>::Vector(&local_dc,1.0,0.0,0.0,1.0);
              bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                                ((LoadStoreMachine *)this,0x822d,&local_cc,&local_dc);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                tcu::Vector<int,_4>::Vector(&local_ec,1,-2,3,-4);
                tcu::Vector<int,_4>::Vector(&local_fc,1,-2,3,-4);
                bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
                                  ((LoadStoreMachine *)this,0x8d82,&local_ec,&local_fc);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  tcu::Vector<int,_4>::Vector(&local_10c,1,-2,3,-4);
                  tcu::Vector<int,_4>::Vector(&local_11c,1,-2,0,1);
                  bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
                                    ((LoadStoreMachine *)this,0x823b,&local_10c,&local_11c);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    tcu::Vector<int,_4>::Vector(&local_12c,1,-2,3,-4);
                    tcu::Vector<int,_4>::Vector(&local_13c,1,0,0,1);
                    bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                            Write<tcu::Vector<int,4>>
                                      ((LoadStoreMachine *)this,0x8235,&local_12c,&local_13c);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      tcu::Vector<float,_4>::Vector(&local_14c,1.0,2.0,3.0,4.0);
                      tcu::Vector<float,_4>::Vector(&local_15c,1.0,2.0,3.0,1.0);
                      bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                              Write<tcu::Vector<float,4>>
                                        ((LoadStoreMachine *)this,0x8c3a,&local_14c,&local_15c);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        tcu::Vector<int,_4>::Vector(&local_16c,1,-2,3,-4);
                        tcu::Vector<int,_4>::Vector(&local_17c,1,-2,3,-4);
                        bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                                Write<tcu::Vector<int,4>>
                                          ((LoadStoreMachine *)this,0x8d88,&local_16c,&local_17c);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          tcu::Vector<int,_4>::Vector(&local_18c,1,-2,3,-4);
                          tcu::Vector<int,_4>::Vector(&local_19c,1,-2,0,1);
                          bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                                  Write<tcu::Vector<int,4>>
                                            ((LoadStoreMachine *)this,0x8239,&local_18c,&local_19c);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            tcu::Vector<int,_4>::Vector(&local_1ac,1,-2,3,-4);
                            tcu::Vector<int,_4>::Vector(&local_1bc,1,0,0,1);
                            bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                                    Write<tcu::Vector<int,4>>
                                              ((LoadStoreMachine *)this,0x8233,&local_1ac,&local_1bc
                                              );
                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                              tcu::Vector<int,_4>::Vector(&local_1cc,1,-2,3,-4);
                              tcu::Vector<int,_4>::Vector(&local_1dc,1,-2,3,-4);
                              bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                                      Write<tcu::Vector<int,4>>
                                                ((LoadStoreMachine *)this,0x8d8e,&local_1cc,
                                                 &local_1dc);
                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                tcu::Vector<int,_4>::Vector(&local_1ec,1,-2,3,-4);
                                tcu::Vector<int,_4>::Vector(&local_1fc,1,-2,0,1);
                                bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                                        Write<tcu::Vector<int,4>>
                                                  ((LoadStoreMachine *)this,0x8237,&local_1ec,
                                                   &local_1fc);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  tcu::Vector<int,_4>::Vector(&local_20c,1,-2,3,-4);
                                  tcu::Vector<int,_4>::Vector(&local_21c,1,0,0,1);
                                  bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                                          Write<tcu::Vector<int,4>>
                                                    ((LoadStoreMachine *)this,0x8231,&local_20c,
                                                     &local_21c);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    tcu::Vector<unsigned_int,_4>::Vector(&local_22c,0,1,2,3);
                                    tcu::Vector<unsigned_int,_4>::Vector(&local_23c,0,1,2,3);
                                    bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                                            Write<tcu::Vector<unsigned_int,4>>
                                                      ((LoadStoreMachine *)this,0x8d70,&local_22c,
                                                       &local_23c);
                                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                                      tcu::Vector<unsigned_int,_4>::Vector(&local_24c,0,1,2,3);
                                      tcu::Vector<unsigned_int,_4>::Vector(&local_25c,0,1,2,3);
                                      bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                                              Write<tcu::Vector<unsigned_int,4>>
                                                        ((LoadStoreMachine *)this,0x906f,&local_24c,
                                                         &local_25c);
                                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                                        tcu::Vector<unsigned_int,_4>::Vector(&local_26c,0,1,2,3);
                                        tcu::Vector<unsigned_int,_4>::Vector(&local_27c,0,1,0,1);
                                        bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                                                Write<tcu::Vector<unsigned_int,4>>
                                                          ((LoadStoreMachine *)this,0x823c,
                                                           &local_26c,&local_27c);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          tcu::Vector<unsigned_int,_4>::Vector(&local_28c,7,2,3,4);
                                          tcu::Vector<unsigned_int,_4>::Vector(&local_29c,7,0,0,1);
                                          bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine::
                                                  Write<tcu::Vector<unsigned_int,4>>
                                                            ((LoadStoreMachine *)this,0x8236,
                                                             &local_28c,&local_29c);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            tcu::Vector<unsigned_int,_4>::Vector(&local_2ac,0,1,2,3)
                                            ;
                                            tcu::Vector<unsigned_int,_4>::Vector(&local_2bc,0,1,2,3)
                                            ;
                                            bVar1 = gl4cts::(anonymous_namespace)::LoadStoreMachine
                                                    ::Write<tcu::Vector<unsigned_int,4>>
                                                              ((LoadStoreMachine *)this,0x8d76,
                                                               &local_2ac,&local_2bc);
                                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                                              tcu::Vector<unsigned_int,_4>::Vector
                                                        (&local_2cc,0,1,2,3);
                                              tcu::Vector<unsigned_int,_4>::Vector
                                                        (&local_2dc,0,1,0,1);
                                              bVar1 = gl4cts::(anonymous_namespace)::
                                                      LoadStoreMachine::
                                                      Write<tcu::Vector<unsigned_int,4>>
                                                                ((LoadStoreMachine *)this,0x823a,
                                                                 &local_2cc,&local_2dc);
                                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                tcu::Vector<unsigned_int,_4>::Vector
                                                          (&local_2ec,7,2,3,4);
                                                tcu::Vector<unsigned_int,_4>::Vector
                                                          (&local_2fc,7,0,0,1);
                                                bVar1 = gl4cts::(anonymous_namespace)::
                                                        LoadStoreMachine::
                                                        Write<tcu::Vector<unsigned_int,4>>
                                                                  ((LoadStoreMachine *)this,0x8234,
                                                                   &local_2ec,&local_2fc);
                                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                  tcu::Vector<unsigned_int,_4>::Vector
                                                            (&local_30c,0,1,2,3);
                                                  tcu::Vector<unsigned_int,_4>::Vector
                                                            (&local_31c,0,1,2,3);
                                                  bVar1 = gl4cts::(anonymous_namespace)::
                                                          LoadStoreMachine::
                                                          Write<tcu::Vector<unsigned_int,4>>
                                                                    ((LoadStoreMachine *)this,0x8d7c
                                                                     ,&local_30c,&local_31c);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<unsigned_int,_4>::Vector
                                                              (&local_32c,0,1,2,3);
                                                    tcu::Vector<unsigned_int,_4>::Vector
                                                              (&local_33c,0,1,0,1);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            LoadStoreMachine::
                                                            Write<tcu::Vector<unsigned_int,4>>
                                                                      ((LoadStoreMachine *)this,
                                                                       0x8238,&local_32c,&local_33c)
                                                    ;
                                                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                      tcu::Vector<unsigned_int,_4>::Vector
                                                                (&local_34c,7,2,3,4);
                                                      tcu::Vector<unsigned_int,_4>::Vector
                                                                (&local_35c,7,0,0,1);
                                                      bVar1 = gl4cts::(anonymous_namespace)::
                                                              LoadStoreMachine::
                                                              Write<tcu::Vector<unsigned_int,4>>
                                                                        ((LoadStoreMachine *)this,
                                                                         0x8232,&local_34c,
                                                                         &local_35c);
                                                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                        tcu::Vector<float,_4>::Vector
                                                                  (&local_36c,1.0);
                                                        tcu::Vector<float,_4>::Vector
                                                                  (&local_37c,1.0);
                                                        bVar1 = gl4cts::(anonymous_namespace)::
                                                                LoadStoreMachine::
                                                                Write<tcu::Vector<float,4>>
                                                                          ((LoadStoreMachine *)this,
                                                                           0x805b,&local_36c,
                                                                           &local_37c);
                                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                          tcu::Vector<float,_4>::Vector
                                                                    (&local_38c,1.0);
                                                          tcu::Vector<float,_4>::Vector
                                                                    (&local_39c,1.0);
                                                          bVar1 = gl4cts::(anonymous_namespace)::
                                                                  LoadStoreMachine::
                                                                  Write<tcu::Vector<float,4>>
                                                                            ((LoadStoreMachine *)
                                                                             this,0x8059,&local_38c,
                                                                             &local_39c);
                                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                            tcu::Vector<float,_4>::Vector
                                                                      (&local_3ac,1.0);
                                                            tcu::Vector<float,_4>::Vector
                                                                      (&local_3bc,1.0,1.0,0.0,1.0);
                                                            bVar1 = gl4cts::(anonymous_namespace)::
                                                                    LoadStoreMachine::
                                                                    Write<tcu::Vector<float,4>>
                                                                              ((LoadStoreMachine *)
                                                                               this,0x822c,
                                                                               &local_3ac,&local_3bc
                                                                              );
                                                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                              tcu::Vector<float,_4>::Vector
                                                                        (&local_3cc,1.0);
                                                              tcu::Vector<float,_4>::Vector
                                                                        (&local_3dc,1.0,0.0,0.0,1.0)
                                                              ;
                                                              bVar1 = gl4cts::(anonymous_namespace)
                                                                      ::LoadStoreMachine::
                                                                      Write<tcu::Vector<float,4>>
                                                                                ((LoadStoreMachine *
                                                                                 )this,0x822a,
                                                                                 &local_3cc,
                                                                                 &local_3dc);
                                                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                                tcu::Vector<float,_4>::Vector
                                                                          (&local_3ec,1.0);
                                                                tcu::Vector<float,_4>::Vector
                                                                          (&local_3fc,1.0);
                                                                bVar1 = gl4cts::
                                                  (anonymous_namespace)::LoadStoreMachine::
                                                  Write<tcu::Vector<float,4>>
                                                            ((LoadStoreMachine *)this,0x8058,
                                                             &local_3ec,&local_3fc);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector(&local_40c,1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_41c,1.0,1.0,0.0,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            LoadStoreMachine::
                                                            Write<tcu::Vector<float,4>>
                                                                      ((LoadStoreMachine *)this,
                                                                       0x822b,&local_40c,&local_41c)
                                                    ;
                                                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                      tcu::Vector<float,_4>::Vector(&local_42c,1.0);
                                                      tcu::Vector<float,_4>::Vector
                                                                (&local_43c,1.0,0.0,0.0,1.0);
                                                      bVar1 = gl4cts::(anonymous_namespace)::
                                                              LoadStoreMachine::
                                                              Write<tcu::Vector<float,4>>
                                                                        ((LoadStoreMachine *)this,
                                                                         0x8229,&local_42c,
                                                                         &local_43c);
                                                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                        tcu::Vector<float,_4>::Vector
                                                                  (&local_44c,1.0,-1.0,1.0,-1.0);
                                                        tcu::Vector<float,_4>::Vector
                                                                  (&local_45c,1.0,-1.0,1.0,-1.0);
                                                        bVar1 = gl4cts::(anonymous_namespace)::
                                                                LoadStoreMachine::
                                                                Write<tcu::Vector<float,4>>
                                                                          ((LoadStoreMachine *)this,
                                                                           0x8f9b,&local_44c,
                                                                           &local_45c);
                                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                          tcu::Vector<float,_4>::Vector
                                                                    (&local_46c,-1.0);
                                                          tcu::Vector<float,_4>::Vector
                                                                    (&local_47c,-1.0,-1.0,0.0,1.0);
                                                          bVar1 = gl4cts::(anonymous_namespace)::
                                                                  LoadStoreMachine::
                                                                  Write<tcu::Vector<float,4>>
                                                                            ((LoadStoreMachine *)
                                                                             this,0x8f99,&local_46c,
                                                                             &local_47c);
                                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                            tcu::Vector<float,_4>::Vector
                                                                      (&local_48c,-1.0,1.0,-1.0,1.0)
                                                            ;
                                                            tcu::Vector<float,_4>::Vector
                                                                      (&local_49c,-1.0,0.0,0.0,1.0);
                                                            bVar1 = gl4cts::(anonymous_namespace)::
                                                                    LoadStoreMachine::
                                                                    Write<tcu::Vector<float,4>>
                                                                              ((LoadStoreMachine *)
                                                                               this,0x8f98,
                                                                               &local_48c,&local_49c
                                                                              );
                                                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                              tcu::Vector<float,_4>::Vector
                                                                        (&local_4ac,1.0,-1.0,1.0,
                                                                         -1.0);
                                                              tcu::Vector<float,_4>::Vector
                                                                        (&local_4bc,1.0,-1.0,1.0,
                                                                         -1.0);
                                                              bVar1 = gl4cts::(anonymous_namespace)
                                                                      ::LoadStoreMachine::
                                                                      Write<tcu::Vector<float,4>>
                                                                                ((LoadStoreMachine *
                                                                                 )this,0x8f97,
                                                                                 &local_4ac,
                                                                                 &local_4bc);
                                                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                                tcu::Vector<float,_4>::Vector
                                                                          (&local_4cc,-1.0);
                                                                tcu::Vector<float,_4>::Vector
                                                                          (&local_4dc,-1.0,-1.0,0.0,
                                                                           1.0);
                                                                bVar1 = gl4cts::
                                                  (anonymous_namespace)::LoadStoreMachine::
                                                  Write<tcu::Vector<float,4>>
                                                            ((LoadStoreMachine *)this,0x8f95,
                                                             &local_4cc,&local_4dc);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_4ec,-1.0,1.0,-1.0,1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_4fc,-1.0,0.0,0.0,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            LoadStoreMachine::
                                                            Write<tcu::Vector<float,4>>
                                                                      ((LoadStoreMachine *)this,
                                                                       0x8f94,&local_4ec,&local_4fc)
                                                    ;
                                                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                      this_local = (LoadStoreMachine *)0x0;
                                                    }
                                                    else {
                                                      this_local = (LoadStoreMachine *)
                                                                   &DAT_ffffffffffffffff;
                                                    }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (LoadStoreMachine *)
                                                                 &DAT_ffffffffffffffff;
                                                  }
                                                }
                                                else {
                                                  this_local = (LoadStoreMachine *)
                                                               &DAT_ffffffffffffffff;
                                                }
                                              }
                                              else {
                                                this_local = (LoadStoreMachine *)
                                                             &DAT_ffffffffffffffff;
                                              }
                                            }
                                            else {
                                              this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff
                                              ;
                                            }
                                          }
                                          else {
                                            this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                                          }
                                        }
                                        else {
                                          this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                                        }
                                      }
                                      else {
                                        this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                                      }
                                    }
                                    else {
                                      this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                                    }
                                  }
                                  else {
                                    this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                                  }
                                }
                                else {
                                  this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                                }
                              }
                              else {
                                this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                              }
                            }
                            else {
                              this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                            }
                          }
                          else {
                            this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (LoadStoreMachine *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (LoadStoreMachine *)0x10;
  }
  return (long)this_local;
}

Assistant:

long RunStage(int stage)
	{
		if (!SupportedInStage(stage, 8))
			return NOT_SUPPORTED;

		glEnable(GL_RASTERIZER_DISCARD);
		m_stage = stage;

		if (!Write(GL_RGBA32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;
		if (!Write(GL_RG32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Write(GL_R32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Write(GL_RGBA16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;
		if (!Write(GL_RG16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Write(GL_R16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Write(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(GL_RG32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 0, 1)))
			return ERROR;
		if (!Write(GL_R32I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;

		if (!Write(GL_R11F_G11F_B10F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 1.0f)))
			return ERROR;

		if (!Write(GL_RGBA16I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(GL_RG16I, ivec4(1, -2, 3, -4), ivec4(1, -2, 0, 1)))
			return ERROR;
		if (!Write(GL_R16I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;

		if (!Write(GL_RGBA8I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(GL_RG8I, ivec4(1, -2, 3, -4), ivec4(1, -2, 0, 1)))
			return ERROR;
		if (!Write(GL_R8I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;

		if (!Write(GL_RGBA32UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Write(GL_RGB10_A2UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Write(GL_RG32UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 0, 1)))
			return ERROR;
		if (!Write(GL_R32UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;

		if (!Write(GL_RGBA16UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Write(GL_RG16UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 0, 1)))
			return ERROR;
		if (!Write(GL_R16UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;

		if (!Write(GL_RGBA8UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Write(GL_RG8UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 0, 1)))
			return ERROR;
		if (!Write(GL_R8UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;

		if (!Write(GL_RGBA16, vec4(1.0f), vec4(1.0f)))
			return ERROR;
		if (!Write(GL_RGB10_A2, vec4(1.0f), vec4(1.0f)))
			return ERROR;
		if (!Write(GL_RG16, vec4(1.0f), vec4(1.0f, 1.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Write(GL_R16, vec4(1.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Write(GL_RGBA8, vec4(1.0f), vec4(1.0f)))
			return ERROR;
		if (!Write(GL_RG8, vec4(1.0f), vec4(1.0f, 1.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Write(GL_R8, vec4(1.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		//
		{
			if (!Write(GL_RGBA16_SNORM, vec4(1.0f, -1.0f, 1.0f, -1.0f), vec4(1.0f, -1.0f, 1.0f, -1.0f)))
				return ERROR;
			if (!Write(GL_RG16_SNORM, vec4(-1.0f), vec4(-1.0f, -1.0f, 0.0f, 1.0f)))
				return ERROR;
			if (!Write(GL_R16_SNORM, vec4(-1.0f, 1.0f, -1.0f, 1.0f), vec4(-1.0f, 0.0f, 0.0f, 1.0f)))
				return ERROR;

			if (!Write(GL_RGBA8_SNORM, vec4(1.0f, -1.0f, 1.0f, -1.0f), vec4(1.0f, -1.0f, 1.0f, -1.0f)))
				return ERROR;
			if (!Write(GL_RG8_SNORM, vec4(-1.0f), vec4(-1.0f, -1.0f, 0.0f, 1.0f)))
				return ERROR;
			if (!Write(GL_R8_SNORM, vec4(-1.0f, 1.0f, -1.0f, 1.0f), vec4(-1.0f, 0.0f, 0.0f, 1.0f)))
				return ERROR;
		}
		return NO_ERROR;
	}